

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  uint uVar2;
  OptionAdder *pOVar3;
  ostream *poVar4;
  size_t sVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool erase_old_mdsplit_files;
  bool trace;
  bool remove_autotoc;
  bool update_links;
  bool add_front_matter;
  bool indent_headers;
  bool jekyll_escape;
  bool include_toc;
  short max_split_level;
  allocator<char> local_c31;
  allocator<char> local_c30;
  allocator<char> local_c2f;
  allocator<char> local_c2e;
  allocator<char> local_c2d;
  allocator<char> local_c2c;
  allocator<char> local_c2b;
  allocator<char> local_c2a;
  allocator<char> local_c29;
  allocator<char> local_c28;
  allocator<char> local_c27;
  allocator<char> local_c26;
  allocator<char> local_c25;
  allocator<char> local_c24;
  allocator<char> local_c23;
  allocator<char> local_c22;
  allocator<char> local_c21;
  allocator<char> local_c20;
  allocator<char> local_c1f;
  allocator<char> local_c1e;
  allocator<char> local_c1d;
  allocator<char> local_c1c;
  allocator<char> local_c1b;
  allocator<char> local_c1a;
  allocator<char> local_c19;
  allocator<char> local_c18;
  allocator<char> local_c17;
  allocator<char> local_c16;
  allocator<char> local_c15;
  allocator<char> local_c14;
  allocator<char> local_c13;
  allocator<char> local_c12;
  allocator<char> local_c11;
  allocator<char> local_c10;
  allocator<char> local_c0f;
  allocator<char> local_c0e;
  allocator<char> local_c0d;
  allocator<char> local_c0c;
  allocator<char> local_c0b;
  allocator<char> local_c0a;
  allocator<char> local_c09;
  path local_c08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_be0;
  int argc_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_bb8;
  string local_b98 [32];
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  element_type *local_ad8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_ad0 [3];
  bool show_version;
  undefined7 uStack_ab7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ab0 [3];
  element_type *local_a98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a90;
  element_type *local_a88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a80;
  shared_ptr<const_cxxopts::Value> local_a78;
  element_type *local_a68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a60;
  shared_ptr<const_cxxopts::Value> local_a58;
  element_type *local_a48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a40;
  shared_ptr<const_cxxopts::Value> local_a38;
  element_type *local_a28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a20;
  shared_ptr<const_cxxopts::Value> local_a18;
  bool show_help;
  undefined7 uStack_a07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_a00 [3];
  element_type *local_9e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9e0;
  shared_ptr<const_cxxopts::Value> local_9d8;
  element_type *local_9c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9c0;
  shared_ptr<const_cxxopts::Value> local_9b8;
  element_type *local_9a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9a0;
  shared_ptr<const_cxxopts::Value> local_998;
  long *local_980;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_978;
  long *local_970;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_968;
  long *local_960;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_958;
  long *local_950;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_948;
  long *local_940;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_938;
  long *local_930;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_928;
  long *local_920;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_918;
  long *local_910;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_908;
  long *local_900;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8f8;
  long *local_8f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8e8;
  char **argv_local;
  string local_8d8;
  string input;
  mdsplitter m;
  allocator<char> local_7b8 [32];
  string local_798;
  string local_778;
  allocator<char> local_758 [32];
  string local_738;
  string local_718;
  allocator<char> local_6f8 [32];
  string local_6d8;
  string local_6b8;
  allocator<char> local_698 [32];
  string local_678;
  string local_658;
  string repository;
  string output;
  shared_ptr<const_cxxopts::Value> local_5f8;
  shared_ptr<const_cxxopts::Value> local_5e8;
  element_type *local_5d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5d0;
  shared_ptr<const_cxxopts::Value> local_5c8;
  element_type *local_5b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5b0;
  shared_ptr<const_cxxopts::Value> local_5a8;
  shared_ptr<const_cxxopts::Value> local_598;
  shared_ptr<const_cxxopts::Value> local_588;
  shared_ptr<const_cxxopts::Value> local_578;
  shared_ptr<const_cxxopts::Value> local_568;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0 [32];
  string local_4b0;
  string local_490;
  string local_470;
  string local_450 [32];
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  ParseResult result;
  string local_170 [32];
  Options options;
  
  argc_local = argc;
  argv_local = argv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"mdsplit",(allocator<char> *)&m);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Generate documentation from README.md files",
             (allocator<char> *)&result);
  cxxopts::Options::Options(&options,&local_250,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"README.md",(allocator<char> *)&m);
  std::__cxx11::string::string<std::allocator<char>>((string *)&output,"docs",(allocator<char> *)&m)
  ;
  repository._M_dataplus._M_p = (pointer)&repository.field_2;
  repository._M_string_length = 0;
  repository.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"File",(allocator<char> *)&local_6d8);
  cxxopts::Options::add_options((OptionAdder *)&m,&options,&local_290);
  std::__cxx11::string::string<std::allocator<char>>((string *)&result,"i,input",local_6f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c08,"Input file",(allocator<char> *)&local_718);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_b38,&input);
  _Var1._M_p = local_b38._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_be0,"README.md",(allocator<char> *)&local_738);
  (**(code **)(*(long *)_Var1._M_p + 0x50))(&local_ad8,_Var1._M_p,&local_be0);
  local_568.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_ad8;
  local_568.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_ad0[0]._M_pi;
  local_ad8 = (element_type *)0x0;
  a_Stack_ad0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"",local_758);
  pOVar3 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)&m,(string *)&result,&local_c08._M_pathname,&local_568,
                      &local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b58,"o,output",(allocator<char> *)&local_778);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b78,"Output directory",(allocator<char> *)&local_798);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&show_version,&output);
  std::__cxx11::string::string<std::allocator<char>>(local_b98,"docs",local_7b8);
  (**(code **)(*(long *)CONCAT71(uStack_ab7,show_version) + 0x50))
            (&show_help,(long *)CONCAT71(uStack_ab7,show_version),local_b98);
  local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_show_help;
  local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_a00[0]._M_pi;
  _show_help = (pointer)0x0;
  a_Stack_a00[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"",(allocator<char> *)&local_658);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_b58,&local_b78,&local_578,&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af8,"r,repository",(allocator<char> *)&local_678);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b18,"Output repository",local_698);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_8d8,&repository);
  local_588.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_8d8._M_dataplus._M_p;
  local_588.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8d8._M_string_length;
  local_8d8._M_dataplus._M_p = (pointer)0x0;
  local_8d8._M_string_length = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"",(allocator<char> *)&local_6b8);
  cxxopts::OptionAdder::operator()(pOVar3,&local_af8,&local_b18,&local_588,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_588.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_8d8._M_string_length);
  std::__cxx11::string::~string((string *)&local_b18);
  std::__cxx11::string::~string((string *)&local_af8);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_a00);
  std::__cxx11::string::~string(local_b98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_ab0);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_568.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_ad0);
  std::__cxx11::string::~string((string *)&local_be0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b38._M_string_length);
  std::__cxx11::string::~string((string *)&local_c08);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&m.input_._M_pathname._M_string_length);
  std::__cxx11::string::~string((string *)&local_290);
  max_split_level = 6;
  local_bb8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_bb8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_bb8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  include_toc = false;
  jekyll_escape = true;
  indent_headers = true;
  add_front_matter = true;
  update_links = true;
  remove_autotoc = true;
  trace = true;
  erase_old_mdsplit_files = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"Behaviour",&local_c09);
  cxxopts::Options::add_options((OptionAdder *)&m,&options,&local_310);
  std::__cxx11::string::string<std::allocator<char>>((string *)&result,"l,level",&local_c0a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c08,"Max level for which we should split the file",&local_c0b);
  cxxopts::value<short>((cxxopts *)&local_8f0,&max_split_level);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_be0,"6",&local_c0c);
  (**(code **)(*local_8f0 + 0x50))(&local_9a8,local_8f0,&local_be0);
  local_998.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_9a8;
  local_998.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_9a0._M_pi;
  local_9a8 = (element_type *)0x0;
  _Stack_9a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_c0d);
  pOVar3 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)&m,(string *)&result,&local_c08._M_pathname,&local_998,
                      &local_330);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b58,"c,clear-html",&local_c0e)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b78,"List of HTML tags mdsplit should clear",&local_c0f);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((cxxopts *)&local_900,&local_bb8);
  std::__cxx11::string::string<std::allocator<char>>(local_b98,"details,summary",&local_c10);
  (**(code **)(*local_900 + 0x50))(&local_9c8,local_900,local_b98);
  local_9b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_9c8;
  local_9b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_9c0._M_pi;
  local_9c8 = (element_type *)0x0;
  _Stack_9c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"",&local_c11);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_b58,&local_b78,&local_9b8,&local_350);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_af8,"t,toc",&local_c12);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b18,"Create a table of contents for the new files",&local_c13);
  cxxopts::value<bool>((cxxopts *)&local_910,&include_toc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad8,"false",&local_c14);
  (**(code **)(*local_910 + 0x50))(&local_9e8,local_910,&local_ad8);
  local_9d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_9e8;
  local_9d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_9e0._M_pi;
  local_9e8 = (element_type *)0x0;
  _Stack_9e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"",&local_c15);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_af8,&local_b18,&local_9d8,&local_370);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b38,"e,erase-old-mdsplit-files",&local_c16);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&show_help,"Erase old md files also generated with mdsplit",&local_c17);
  cxxopts::value<bool>((cxxopts *)&local_920,&erase_old_mdsplit_files);
  std::__cxx11::string::string<std::allocator<char>>((string *)&show_version,"true",&local_c18);
  (**(code **)(*local_920 + 0x50))(&local_a28,local_920,&show_version);
  local_a18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a28;
  local_a18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_a20._M_pi;
  local_a28 = (element_type *)0x0;
  _Stack_a20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"",&local_c19);
  pOVar3 = cxxopts::OptionAdder::operator()
                     (pOVar3,&local_b38,(string *)&show_help,&local_a18,&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,"j,jekyll-escape",&local_c1a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"Escape consecutive \"{{\"s for Jekyll processing",&local_c1b);
  cxxopts::value<bool>((cxxopts *)&local_930,&jekyll_escape);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_6f8,"true",&local_c1c);
  (**(code **)(*local_930 + 0x50))(&local_a48,local_930,local_6f8);
  local_a38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a48;
  local_a38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_a40._M_pi;
  local_a48 = (element_type *)0x0;
  _Stack_a40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"",&local_c1d);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_8d8,&local_6d8,&local_a38,&local_3b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_718,"header-reindent",&local_c1e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_738,"Reindent headers to match the new files",&local_c1f);
  cxxopts::value<bool>((cxxopts *)&local_940,&indent_headers);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_758,"true",&local_c20);
  (**(code **)(*local_940 + 0x50))(&local_a68,local_940,local_758);
  local_a58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a68;
  local_a58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_a60._M_pi;
  local_a68 = (element_type *)0x0;
  _Stack_a60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"",&local_c21);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_718,&local_738,&local_a58,&local_3d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_778,"f,front-matter",&local_c22);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,"Include a front-matter in the new files",&local_c23);
  cxxopts::value<bool>((cxxopts *)&local_950,&add_front_matter);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_7b8,"true",&local_c24);
  (**(code **)(*local_950 + 0x50))(&local_a88,local_950,local_7b8);
  local_a78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a88;
  local_a78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_a80._M_pi;
  local_a88 = (element_type *)0x0;
  _Stack_a80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"",&local_c25);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_778,&local_798,&local_a78,&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"u,url-update",&local_c26)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_678,"Update relative URLs to their new relative paths",&local_c27);
  cxxopts::value<bool>((cxxopts *)&local_960,&update_links);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_698,"true",&local_c28);
  (**(code **)(*local_960 + 0x50))(&local_a98,local_960,local_698);
  local_598.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a98;
  local_598.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_a90._M_pi;
  local_a98 = (element_type *)0x0;
  _Stack_a90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"",&local_c29);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_658,&local_678,&local_598,&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"remove-auto-toc",&local_c2a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"Remove automatic table of contents",&local_c2b);
  cxxopts::value<bool>((cxxopts *)&local_970,&remove_autotoc);
  std::__cxx11::string::string<std::allocator<char>>(local_450,"true",&local_c2c);
  (**(code **)(*local_970 + 0x50))(&local_5b8,local_970,local_450);
  local_5a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_5b8;
  local_5a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_5b0._M_pi;
  local_5b8 = (element_type *)0x0;
  _Stack_5b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"",&local_c2d);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_6b8,&local_430,&local_5a8,&local_470);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"trace",&local_c2e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"Trace commands",&local_c2f);
  cxxopts::value<bool>((cxxopts *)&local_980,&trace);
  std::__cxx11::string::string<std::allocator<char>>(local_4d0,"true",&local_c30);
  (**(code **)(*local_980 + 0x50))(&local_5d8,local_980,local_4d0);
  local_5c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_5d8;
  local_5c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_5d0._M_pi;
  local_5d8 = (element_type *)0x0;
  _Stack_5d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"",&local_c31);
  cxxopts::OptionAdder::operator()(pOVar3,&local_490,&local_4b0,&local_5c8,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5d0);
  std::__cxx11::string::~string(local_4d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_978);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5b0);
  std::__cxx11::string::~string(local_450);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_968);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_410);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_598.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a90);
  std::__cxx11::string::~string((string *)local_698);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_958);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a80);
  std::__cxx11::string::~string((string *)local_7b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_948);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string((string *)&local_778);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a60);
  std::__cxx11::string::~string((string *)local_758);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_938);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a40);
  std::__cxx11::string::~string((string *)local_6f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_928);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_390);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a20);
  std::__cxx11::string::~string((string *)&show_version);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_918);
  std::__cxx11::string::~string((string *)&show_help);
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string((string *)&local_370);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_9d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_9e0);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_908);
  std::__cxx11::string::~string((string *)&local_b18);
  std::__cxx11::string::~string((string *)&local_af8);
  std::__cxx11::string::~string((string *)&local_350);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_9b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_9c0);
  std::__cxx11::string::~string(local_b98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8f8);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_330);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_998.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_9a0);
  std::__cxx11::string::~string((string *)&local_be0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8e8);
  std::__cxx11::string::~string((string *)&local_c08);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&m.input_._M_pathname._M_string_length);
  std::__cxx11::string::~string((string *)&local_310);
  show_help = true;
  show_version = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"Help",(allocator<char> *)&local_8d8);
  cxxopts::Options::add_options((OptionAdder *)&m,&options,&local_510);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"h,help",(allocator<char> *)&local_6d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c08,"Print usage",local_6f8);
  cxxopts::value<bool>((cxxopts *)&local_b18,&show_help);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_be0,"false",(allocator<char> *)&local_718);
  (**(code **)(*(long *)local_b18._M_dataplus._M_p + 0x50))
            (&local_af8,local_b18._M_dataplus._M_p,&local_be0);
  local_5e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_af8._M_dataplus._M_p;
  local_5e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_af8._M_string_length;
  local_af8._M_dataplus._M_p = (pointer)0x0;
  local_af8._M_string_length = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"",(allocator<char> *)&local_738);
  pOVar3 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)&m,(string *)&result,&local_c08._M_pathname,&local_5e8,
                      &local_530);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b58,"v,version",local_758);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b78,"Print version",(allocator<char> *)&local_778);
  cxxopts::value<bool>((cxxopts *)&local_b38,&show_version);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b98,"false",(allocator<char> *)&local_798);
  (**(code **)(*(long *)local_b38._M_dataplus._M_p + 0x50))
            (&local_ad8,local_b38._M_dataplus._M_p,local_b98);
  local_5f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_ad8;
  local_5f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_ad0[0]._M_pi;
  local_ad8 = (element_type *)0x0;
  a_Stack_ad0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"",local_7b8);
  cxxopts::OptionAdder::operator()(pOVar3,&local_b58,&local_b78,&local_5f8,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_ad0);
  std::__cxx11::string::~string(local_b98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b38._M_string_length);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_530);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_af8._M_string_length);
  std::__cxx11::string::~string((string *)&local_be0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b18._M_string_length);
  std::__cxx11::string::~string((string *)&local_c08);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&m.input_._M_pathname._M_string_length);
  std::__cxx11::string::~string((string *)&local_510);
  cxxopts::Options::parse(&result,&options,&argc_local,&argv_local);
  if (input._M_string_length == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Please provide an input file");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  if (show_help == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&m,"help",(allocator<char> *)&local_c08);
    sVar5 = cxxopts::ParseResult::count(&result,(string *)&m);
    std::__cxx11::string::~string((string *)&m);
    if (sVar5 == 0) {
      if (show_version == true) {
        poVar4 = std::operator<<((ostream *)&std::cout,"mdsplit: version 0.0.1");
        uVar2 = 0;
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      else {
        mdsplit::mdsplitter::mdsplitter(&m);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_c08,&input,auto_format);
        mdsplit::mdsplitter::input(&m,&local_c08);
        std::filesystem::__cxx11::path::~path(&local_c08);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_c08,&output,auto_format);
        mdsplit::mdsplitter::output_dir(&m,&local_c08);
        std::filesystem::__cxx11::path::~path(&local_c08);
        mdsplit::mdsplitter::repository(&m,&repository);
        mdsplit::mdsplitter::max_split_level(&m,max_split_level);
        std::
        __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_bb8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_bb8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        __first = std::
                  __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                            (local_bb8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_bb8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(&local_bb8,(const_iterator)__first._M_current,
                (const_iterator)
                local_bb8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
        mdsplit::mdsplitter::clear_html_tags(&m,&local_bb8);
        mdsplit::mdsplitter::include_toc(&m,include_toc);
        mdsplit::mdsplitter::jekyll_escape(&m,jekyll_escape);
        mdsplit::mdsplitter::indent_headers(&m,indent_headers);
        mdsplit::mdsplitter::add_front_matter(&m,add_front_matter);
        mdsplit::mdsplitter::update_links(&m,update_links);
        mdsplit::mdsplitter::remove_autotoc(&m,remove_autotoc);
        mdsplit::mdsplitter::trace(&m,trace);
        mdsplit::mdsplitter::erase_old_mdsplit_files(&m,erase_old_mdsplit_files);
        uVar2 = mdsplit::mdsplitter::run(&m);
        mdsplit::mdsplitter::~mdsplitter(&m);
      }
      goto LAB_00109070;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            (local_170,"-i input_directory -o output_directory -r username/repository",
             (allocator<char> *)&m);
  std::__cxx11::string::operator=((string *)&options.m_custom_help,local_170);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m,"File",(allocator<char> *)&local_b58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m.input_._M_cmpts,"Behaviour",(allocator<char> *)&local_b78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(m.output_dir_._M_pathname.field_2._M_local_buf + 8),"Help",
             (allocator<char> *)local_b98);
  __l._M_len = 3;
  __l._M_array = (iterator)&m;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_be0,__l,(allocator_type *)&local_af8);
  cxxopts::Options::help(&local_c08._M_pathname,&options,&local_be0);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_c08);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_c08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_be0);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_7b8 + lVar6 + -0xd8));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  uVar2 = (uint)(input._M_string_length == 0);
LAB_00109070:
  cxxopts::ParseResult::~ParseResult(&result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_bb8);
  std::__cxx11::string::~string((string *)&repository);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&input);
  cxxopts::Options::~Options(&options);
  return uVar2;
}

Assistant:

int main(int argc, char *argv[]) {
    ///////////////////////////////////////////////////////
    /// Define command line options                     ///
    ///////////////////////////////////////////////////////
    cxxopts::Options options("mdsplit",
                             "Generate documentation from README.md files");
    std::string input = "README.md";
    std::string output = "docs";
    std::string repository;
    options.add_options("File")(
        "i,input", "Input file",
        cxxopts::value(input)->default_value("README.md"))(
        "o,output", "Output directory",
        cxxopts::value(output)->default_value("docs"))(
        "r,repository", "Output repository", cxxopts::value(repository));

    short max_split_level{6};
    std::vector<std::string> clear_html_tags{};
    bool include_toc{false};
    bool jekyll_escape{true};
    bool indent_headers{true};
    bool add_front_matter{true};
    bool update_links{true};
    bool remove_autotoc{true};
    bool trace{true};
    bool erase_old_mdsplit_files{true};
    options.add_options("Behaviour")(
        "l,level", "Max level for which we should split the file",
        cxxopts::value(max_split_level)->default_value("6"))(
        "c,clear-html", "List of HTML tags mdsplit should clear",
        cxxopts::value(clear_html_tags)->default_value("details,summary"))(
        "t,toc", "Create a table of contents for the new files",
        cxxopts::value(include_toc)->default_value("false"))(
        "e,erase-old-mdsplit-files",
        "Erase old md files also generated with mdsplit",
        cxxopts::value(erase_old_mdsplit_files)->default_value("true"))(
        "j,jekyll-escape", "Escape consecutive \"{{\"s for Jekyll processing",
        cxxopts::value(jekyll_escape)->default_value("true"))(
        "header-reindent", "Reindent headers to match the new files",
        cxxopts::value(indent_headers)->default_value("true"))(
        "f,front-matter", "Include a front-matter in the new files",
        cxxopts::value(add_front_matter)->default_value("true"))(
        "u,url-update", "Update relative URLs to their new relative paths",
        cxxopts::value(update_links)->default_value("true"))(
        "remove-auto-toc", "Remove automatic table of contents",
        cxxopts::value(remove_autotoc)->default_value("true"))(
        "trace", "Trace commands",
        cxxopts::value(trace)->default_value("true"));

    bool show_help{true};
    bool show_version{false};
    options.add_options("Help")(
        "h,help", "Print usage",
        cxxopts::value(show_help)->default_value("false"))(
        "v,version", "Print version",
        cxxopts::value(show_version)->default_value("false"));

    ///////////////////////////////////////////////////////
    /// Parse command line options                      ///
    ///////////////////////////////////////////////////////
    auto result = options.parse(argc, argv);

    if (input.empty()) {
        std::cerr << "Please provide an input file" << std::endl;
    }

    if (show_help || result.count("help")) {
        options.custom_help(
            "-i input_directory -o output_directory -r username/repository");
        std::cout << options.help({"File", "Behaviour", "Help"}) << std::endl;
        return input.empty() ? 1 : 0;
    }

    // Show version
    if (show_version) {
        std::cout << "mdsplit: version 0.0.1" << std::endl;
        return 0;
    }

    ///////////////////////////////////////////////////////
    /// Run                                             ///
    ///////////////////////////////////////////////////////
    mdsplit::mdsplitter m;
    m.input(input);
    m.output_dir(output);
    m.repository(repository);
    m.max_split_level(max_split_level);
    std::sort(clear_html_tags.begin(), clear_html_tags.end());
    clear_html_tags.erase(
        std::unique(clear_html_tags.begin(), clear_html_tags.end()),
        clear_html_tags.end());
    m.clear_html_tags(clear_html_tags);
    m.include_toc(include_toc);
    m.jekyll_escape(jekyll_escape);
    m.indent_headers(indent_headers);
    m.add_front_matter(add_front_matter);
    m.update_links(update_links);
    m.remove_autotoc(remove_autotoc);
    m.trace(trace);
    m.erase_old_mdsplit_files(erase_old_mdsplit_files);
    return m.run();
}